

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::QWidgetWindow(QWidgetWindow *this,QWidget *widget)

{
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  QWindowPrivate *this_00;
  ConnectionType type_00;
  QWidget *w;
  long in_FS_OFFSET;
  Object local_48 [8];
  SurfaceType type;
  uint uStack_3c;
  undefined8 local_38;
  Object local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWindowPrivate *)operator_new(0x180);
  memset(this_00,0,0x180);
  QWidgetWindowPrivate::QWidgetWindowPrivate((QWidgetWindowPrivate *)this_00);
  QWindow::QWindow(&this->super_QWindow,this_00,(QWindow *)0x0);
  *(undefined ***)this = &PTR_metaObject_007c2058;
  *(undefined ***)&this->field_0x10 = &PTR__QWidgetWindow_007c2190;
  QPointer<QWidget>::QPointer<void>(&this->m_widget,widget);
  (this->m_dragTarget).wp.d = (Data *)0x0;
  (this->m_dragTarget).wp.value = (QObject *)0x0;
  (this->m_implicit_mouse_grabber).wp.d = (Data *)0x0;
  (this->m_implicit_mouse_grabber).wp.value = (QObject *)0x0;
  updateObjectName(this);
  cVar2 = QCoreApplication::testAttribute(AA_ForceRasterWidgets);
  type_00 = (ConnectionType)this;
  if (cVar2 == '\0') {
    _type = (code *)((ulong)uStack_3c << 0x20);
    pDVar1 = (this->m_widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      w = (QWidget *)0x0;
    }
    else {
      w = (QWidget *)(this->m_widget).wp.value;
    }
    bVar3 = q_evaluateRhiConfig(w,(QPlatformBackingStoreRhiConfig *)0x0,&type);
    if (bVar3) {
      QWindow::setSurfaceType(type_00);
    }
  }
  _type = updateObjectName;
  local_38 = 0;
  QObject::
  connect<void(QObject::*)(QString_const&,QObject::QPrivateSignal),void(QWidgetWindow::*)()>
            (local_30,(offset_in_QObject_to_subr)widget,(ContextType *)QObject::objectNameChanged,
             (offset_in_QWidgetWindow_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  _type = handleScreenChange;
  local_38 = 0;
  QObject::connect<void(QWindow::*)(QScreen*),void(QWidgetWindow::*)()>
            (local_48,(offset_in_QWindow_to_subr)this,(ContextType *)QWindow::screenChanged,
             (offset_in_QWidgetWindow_to_subr *)0x0,type_00);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetWindow::QWidgetWindow(QWidget *widget)
    : QWindow(*new QWidgetWindowPrivate(), nullptr)
    , m_widget(widget)
{
    updateObjectName();
    if (!QCoreApplication::testAttribute(Qt::AA_ForceRasterWidgets)) {
        QSurface::SurfaceType type = QSurface::RasterSurface;
        if (q_evaluateRhiConfig(m_widget, nullptr, &type))
            setSurfaceType(type);
    }

    connect(widget, &QObject::objectNameChanged, this, &QWidgetWindow::updateObjectName);
    connect(this, &QWidgetWindow::screenChanged, this, &QWidgetWindow::handleScreenChange);
}